

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCnf.c
# Opt level: O0

void Sfm_PrintCnf(Vec_Str_t *vCnf)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  int local_18;
  int Lit;
  int i;
  char Entry;
  Vec_Str_t *vCnf_local;
  
  for (local_18 = 0; iVar2 = Vec_StrSize(vCnf), local_18 < iVar2; local_18 = local_18 + 1) {
    cVar1 = Vec_StrEntry(vCnf,local_18);
    iVar2 = (int)cVar1;
    if (iVar2 == -1) {
      printf("\n");
    }
    else {
      iVar3 = Abc_LitIsCompl(iVar2);
      pcVar5 = "";
      if (iVar3 != 0) {
        pcVar5 = "-";
      }
      uVar4 = Abc_Lit2Var(iVar2);
      printf("%s%d ",pcVar5,(ulong)uVar4);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Sfm_PrintCnf( Vec_Str_t * vCnf )
{
    char Entry;
    int i, Lit;
    Vec_StrForEachEntry( vCnf, Entry, i )
    {
        Lit = (int)Entry;
        if ( Lit == -1 )
            printf( "\n" );
        else
            printf( "%s%d ", Abc_LitIsCompl(Lit) ? "-":"", Abc_Lit2Var(Lit) );
    }
}